

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O0

psa_status_t psa_its_get_info(psa_storage_uid_t uid,psa_storage_info_t *p_info)

{
  FILE *local_28;
  FILE *stream;
  psa_storage_info_t *ppStack_18;
  psa_status_t status;
  psa_storage_info_t *p_info_local;
  psa_storage_uid_t uid_local;
  
  local_28 = (FILE *)0x0;
  ppStack_18 = p_info;
  p_info_local = (psa_storage_info_t *)uid;
  stream._4_4_ = psa_its_read_file(uid,p_info,(FILE **)&local_28);
  if (local_28 != (FILE *)0x0) {
    fclose(local_28);
  }
  return stream._4_4_;
}

Assistant:

psa_status_t psa_its_get_info( psa_storage_uid_t uid,
                               struct psa_storage_info_t *p_info )
{
    psa_status_t status;
    FILE *stream = NULL;
    status = psa_its_read_file( uid, p_info, &stream );
    if( stream != NULL )
        fclose( stream );
    return( status );
}